

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptString::GetDiagValueString
          (JavascriptString *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  char16 *str;
  
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  str = GetString(this);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,str,this->m_charLength);
  StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L'\"');
  return 1;
}

Assistant:

BOOL JavascriptString::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        stringBuilder->Append(_u('"'));
        stringBuilder->Append(this->GetString(), this->GetLength());
        stringBuilder->Append(_u('"'));
        return TRUE;
    }